

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac__read_and_seek_residual(ma_dr_flac_bs *bs,ma_uint32 blockSize,ma_uint32 order)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ma_bool32 mVar5;
  ulong uVar6;
  ma_dr_flac_cache_t mVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ushort uVar11;
  ma_uint32 mVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  ma_uint8 riceParam;
  ma_uint8 unencodedBitsPerSample;
  ma_uint8 partitionOrder;
  int local_54;
  ma_uint8 residualMethod;
  int local_4c;
  ulong local_48;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  mVar5 = ma_dr_flac__read_uint8(bs,2,&residualMethod);
  if (((residualMethod < 2 && mVar5 != 0) &&
      (mVar5 = ma_dr_flac__read_uint8(bs,4,&partitionOrder), mVar5 != 0)) && (partitionOrder < 9)) {
    local_40 = blockSize >> (partitionOrder & 0x1f);
    if (order <= local_40 && local_40 - order != 0) {
      local_4c = 1 << (partitionOrder & 0x1f);
      uVar10 = local_40 - order;
      do {
        local_48 = (ulong)uVar10;
        riceParam = '\0';
        if ((residualMethod & 1) == 0) {
          mVar5 = ma_dr_flac__read_uint8(bs,4,&riceParam);
          if (mVar5 == 0) {
            return 0;
          }
          if (riceParam != '\x0f') goto LAB_0016a992;
LAB_0016afb5:
          unencodedBitsPerSample = '\0';
          mVar5 = ma_dr_flac__read_uint8(bs,5,&unencodedBitsPerSample);
          if ((mVar5 == 0) ||
             (mVar5 = ma_dr_flac__seek_bits
                                (bs,(ulong)((int)local_48 * (uint)unencodedBitsPerSample)),
             mVar5 == 0)) {
            return 0;
          }
        }
        else {
          mVar5 = ma_dr_flac__read_uint8(bs,5,&riceParam);
          if (mVar5 == 0) {
            return 0;
          }
          if (riceParam == '\x1f') goto LAB_0016afb5;
LAB_0016a992:
          if (riceParam == 0xff) goto LAB_0016afb5;
          local_38 = (ulong)(riceParam + 1);
          local_3c = 0x3f - riceParam;
          for (local_54 = 0; local_54 != (int)local_48; local_54 = local_54 + 1) {
            uVar6 = bs->cache;
            mVar12 = bs->consumedBits;
            if (ma_dr_flac__gIsLZCNTSupported == 0) {
              if (uVar6 == 0) goto LAB_0016aa82;
              if (uVar6 < 0x1000000000000000) {
                bVar18 = uVar6 >> 0x20 == 0;
                uVar14 = uVar6 << 0x20;
                if (!bVar18) {
                  uVar14 = uVar6;
                }
                iVar15 = (uint)bVar18 * 0x20;
                iVar9 = iVar15 + 0x10;
                uVar4 = uVar14 << 0x10;
                if (0xffffffffffff < uVar14) {
                  iVar9 = iVar15;
                  uVar4 = uVar14;
                }
                iVar15 = iVar9 + 8;
                uVar14 = uVar4 << 8;
                if (0xffffffffffffff < uVar4) {
                  iVar15 = iVar9;
                  uVar14 = uVar4;
                }
                iVar9 = iVar15 + 4;
                uVar4 = uVar14 << 4;
                if (0xfffffffffffffff < uVar14) {
                  iVar9 = iVar15;
                  uVar4 = uVar14;
                }
                iVar9 = iVar9 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                        (uVar4 >> 0x3c) * 4);
              }
              else {
                iVar9 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                (uVar6 >> 0x3c) * 4);
              }
              uVar10 = iVar9 - 1;
            }
            else {
              uVar10 = (uint)LZCOUNT(uVar6);
            }
            while (0x3f < uVar10) {
LAB_0016aa82:
              uVar10 = bs->nextL2Line;
              if ((ulong)uVar10 < 0x200) {
                uVar11 = bs->crc16;
                uVar13 = (uint)uVar11;
                if (bs->crc16CacheIgnoredBytes < 8) {
                  mVar7 = bs->crc16Cache;
                  uVar8 = (uint)mVar7;
                  uVar1 = (ushort)(mVar7 >> 0x30);
                  uVar2 = (uint)(mVar7 >> 0x10);
                  uVar17 = (uint)(mVar7 >> 0x18);
                  uVar3 = (uint)(mVar7 >> 0x20);
                  switch(bs->crc16CacheIgnoredBytes) {
                  case 0:
                    bs->crc16 = ma_dr_flac__crc16_table
                                [((uint)ma_dr_flac__crc16_table
                                        [((uint)ma_dr_flac__crc16_table
                                                [(uVar3 >> 8 ^
                                                 ((uint)ma_dr_flac__crc16_table
                                                        [(uint)(uVar11 >> 8) ^
                                                         (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)uVar1 ^
                                                        ((uint)uVar11 << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar11 >> 8) ^
                                                               (uint)(byte)(mVar7 >> 0x38)]) >> 8 &
                                                        0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(uVar3 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar1 ^
                                                                 ((uint)uVar11 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar11 >> 8) ^
                                                                        (uint)(byte)(mVar7 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar3 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar11 >> 8) ^
                                                                        (uint)(byte)(mVar7 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar1 ^
                                                   ((uint)uVar11 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar11 >> 8) ^
                                                          (uint)(byte)(mVar7 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                0xff]) >> 8 & 0xff ^ uVar17 & 0xff] << 8 ^ uVar8 ^
                                 (uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar3 ^ ((uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar1 ^
                                                                  ((uint)uVar11 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar11 >> 8) ^
                                                                         (uint)(byte)(mVar7 >> 0x38)
                                                                        ]) >> 8 & 0xff) & 0xff] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [(uVar3 >> 8 ^
                                                                   ((uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar11 >> 8) ^
                                                                           (uint)(byte)(mVar7 >> 
                                                  0x38)] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar1 ^
                                                         ((uint)uVar11 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar11 >> 8) ^
                                                                (uint)(byte)(mVar7 >> 0x38)]) >> 8 &
                                                         0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 &
                                                  0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar3 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar11 >> 8) ^
                                                                (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar1 ^
                                                               ((uint)uVar11 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar11 >> 8) ^
                                                                      (uint)(byte)(mVar7 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar3 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar1 ^
                                                                        ((uint)uVar11 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^ (uint)(byte)(mVar7 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar3 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar1 ^
                                                                ((uint)uVar11 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar11 >> 8) ^
                                                                       (uint)(byte)(mVar7 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar17 & 0xff]) >> 8 & 0xff ^ uVar2 & 0xffff) & 0xff
                                       ]) >> 8 & 0xff] << 8 ^
                                ma_dr_flac__crc16_table
                                [(((uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar3 ^ ((uint)ma_dr_flac__crc16_table
                                                                   [((uint)uVar1 ^
                                                                    ((uint)uVar11 << 8 ^
                                                                    (uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar11 >> 8) ^
                                                                           (uint)(byte)(mVar7 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar3 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar1 ^
                                                                ((uint)uVar11 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar11 >> 8) ^
                                                                       (uint)(byte)(mVar7 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar3 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar11 >> 8) ^
                                                                  (uint)(byte)(mVar7 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar1 ^
                                                                   ((uint)uVar11 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar11 >> 8) ^
                                                                          (uint)(byte)(mVar7 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar3 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar1 ^
                                                                          ((uint)uVar11 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^ (uint)(byte)(mVar7 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar3 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar1 ^
                                                                ((uint)uVar11 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar11 >> 8) ^
                                                                       (uint)(byte)(mVar7 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar17 & 0xff]) >> 8 & 0xff ^ uVar2 & 0xffff) &
                                          0xff] << 8 ^
                                  (uint)ma_dr_flac__crc16_table
                                        [((uint)ma_dr_flac__crc16_table
                                                [((uint)ma_dr_flac__crc16_table
                                                        [(uVar3 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar1 ^
                                                                ((uint)uVar11 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar11 >> 8) ^
                                                                       (uint)(byte)(mVar7 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [(uVar3 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar1 ^
                                                                         ((uint)uVar11 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^ (uint)(byte)(mVar7 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar3 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar1 ^
                                                                ((uint)uVar11 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar11 >> 8) ^
                                                                       (uint)(byte)(mVar7 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                 uVar17 & 0xff] << 8 ^ uVar8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(((uint)ma_dr_flac__crc16_table
                                                        [(uVar3 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar1 ^
                                                                          ((uint)uVar11 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^ (uint)(byte)(mVar7 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar3 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar1 ^
                                                                ((uint)uVar11 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar11 >> 8) ^
                                                                       (uint)(byte)(mVar7 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)ma_dr_flac__crc16_table
                                                               [(uVar3 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar11 >> 8) ^
                                                                        (uint)(byte)(mVar7 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar1 ^
                                                   ((uint)uVar11 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar11 >> 8) ^
                                                          (uint)(byte)(mVar7 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar3 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar1 ^
                                                                          ((uint)uVar11 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^ (uint)(byte)(mVar7 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar3 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar1 ^
                                                                ((uint)uVar11 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar11 >> 8) ^
                                                                       (uint)(byte)(mVar7 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar17 & 0xff]) >> 8 & 0xff ^ uVar2 & 0xffff) &
                                                0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar8) & 0xff];
                    break;
                  case 1:
                    uVar13 = (uint)(ushort)(uVar11 << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(ushort)(uVar1 ^ uVar11 >> 8) & 0xff]);
                  case 2:
                    uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar3 ^ uVar13) >> 8 & 0xff]);
                  case 3:
                    uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar3 ^ uVar13 >> 8) & 0xff]);
                  case 4:
                    uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                           ma_dr_flac__crc16_table[uVar13 >> 8 ^ uVar17 & 0xff]);
                  case 5:
                    uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [(ulong)(uVar13 >> 8 ^ uVar2 & 0xffff) & 0xff]);
                  case 6:
                    uVar11 = (ushort)(uVar13 << 8) ^
                             ma_dr_flac__crc16_table[(uVar8 ^ uVar13) >> 8 & 0xff];
                  case 7:
                    uVar11 = uVar11 << 8 ^ ma_dr_flac__crc16_table[(uVar8 ^ uVar11 >> 8) & 0xff];
                    goto LAB_0016ac55;
                  }
                }
                else {
LAB_0016ac55:
                  bs->crc16 = uVar11;
                  bs->crc16CacheIgnoredBytes = 0;
                }
                bs->nextL2Line = uVar10 + 1;
                uVar6 = bs->cacheL2[uVar10];
                uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                        (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                        (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                        (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
                bs->crc16Cache = uVar6;
                mVar12 = 0;
              }
              else {
                mVar5 = ma_dr_flac__reload_cache(bs);
                if (mVar5 == 0) {
                  return 0;
                }
                uVar6 = bs->cache;
                mVar12 = bs->consumedBits;
              }
              if (ma_dr_flac__gIsLZCNTSupported == 0) {
                uVar10 = 0x40;
                if (uVar6 != 0) {
                  if (uVar6 < 0x1000000000000000) {
                    bVar18 = uVar6 >> 0x20 == 0;
                    uVar14 = uVar6 << 0x20;
                    if (!bVar18) {
                      uVar14 = uVar6;
                    }
                    iVar15 = (uint)bVar18 * 0x20;
                    iVar9 = iVar15 + 0x10;
                    uVar4 = uVar14 << 0x10;
                    if (0xffffffffffff < uVar14) {
                      iVar9 = iVar15;
                      uVar4 = uVar14;
                    }
                    iVar15 = iVar9 + 8;
                    uVar14 = uVar4 << 8;
                    if (0xffffffffffffff < uVar4) {
                      iVar15 = iVar9;
                      uVar14 = uVar4;
                    }
                    iVar9 = iVar15 + 4;
                    uVar4 = uVar14 << 4;
                    if (0xfffffffffffffff < uVar14) {
                      iVar9 = iVar15;
                      uVar4 = uVar14;
                    }
                    iVar9 = iVar9 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                             clz_table_4 + (uVar4 >> 0x3c) * 4);
                  }
                  else {
                    iVar9 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                    (uVar6 >> 0x3c) * 4);
                  }
                  uVar10 = iVar9 - 1;
                }
              }
              else {
                uVar10 = (uint)LZCOUNT(uVar6);
              }
            }
            uVar13 = mVar12 + uVar10;
            uVar17 = uVar13 - local_3c;
            if (uVar13 < local_3c || uVar17 == 0) {
              mVar7 = (uVar6 << ((byte)uVar10 & 0x3f)) << ((byte)local_38 & 0x3f);
              uVar13 = uVar13 + (int)local_38;
            }
            else {
              uVar10 = bs->nextL2Line;
              if ((ulong)uVar10 < 0x200) {
                uVar11 = bs->crc16;
                uVar13 = (uint)uVar11;
                if (bs->crc16CacheIgnoredBytes < 8) {
                  mVar7 = bs->crc16Cache;
                  uVar16 = (uint)mVar7;
                  uVar1 = (ushort)(mVar7 >> 0x30);
                  uVar3 = (uint)(mVar7 >> 0x10);
                  uVar2 = (uint)(mVar7 >> 0x18);
                  uVar8 = (uint)(mVar7 >> 0x20);
                  switch(bs->crc16CacheIgnoredBytes) {
                  case 0:
                    bs->crc16 = ma_dr_flac__crc16_table
                                [((uint)ma_dr_flac__crc16_table
                                        [((uint)ma_dr_flac__crc16_table
                                                [(uVar8 >> 8 ^
                                                 ((uint)ma_dr_flac__crc16_table
                                                        [(uint)(uVar11 >> 8) ^
                                                         (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)uVar1 ^
                                                        ((uint)uVar11 << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar11 >> 8) ^
                                                               (uint)(byte)(mVar7 >> 0x38)]) >> 8 &
                                                        0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                [((uint)uVar1 ^
                                                                 ((uint)uVar11 << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar11 >> 8) ^
                                                                        (uint)(byte)(mVar7 >> 0x38)]
                                                                 ) >> 8 & 0xff) & 0xff] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uVar8 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar11 >> 8) ^
                                                                        (uint)(byte)(mVar7 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar1 ^
                                                   ((uint)uVar11 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar11 >> 8) ^
                                                          (uint)(byte)(mVar7 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                0xff]) >> 8 & 0xff ^ uVar2 & 0xff] << 8 ^ uVar16 ^
                                 (uint)ma_dr_flac__crc16_table
                                       [(((uint)ma_dr_flac__crc16_table
                                                [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar1 ^
                                                                  ((uint)uVar11 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar11 >> 8) ^
                                                                         (uint)(byte)(mVar7 >> 0x38)
                                                                        ]) >> 8 & 0xff) & 0xff] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [(uVar8 >> 8 ^
                                                                   ((uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar11 >> 8) ^
                                                                           (uint)(byte)(mVar7 >> 
                                                  0x38)] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar1 ^
                                                         ((uint)uVar11 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar11 >> 8) ^
                                                                (uint)(byte)(mVar7 >> 0x38)]) >> 8 &
                                                         0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 &
                                                  0xff) & 0xff] << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [((uint)ma_dr_flac__crc16_table
                                                       [(uVar8 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar11 >> 8) ^
                                                                (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar1 ^
                                                               ((uint)uVar11 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar11 >> 8) ^
                                                                      (uint)(byte)(mVar7 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff] << 8 ^
                                                (uint)ma_dr_flac__crc16_table
                                                      [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar1 ^
                                                                        ((uint)uVar11 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^ (uint)(byte)(mVar7 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar1 ^
                                                                ((uint)uVar11 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar11 >> 8) ^
                                                                       (uint)(byte)(mVar7 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                uVar2 & 0xff]) >> 8 & 0xff ^ uVar3 & 0xffff) & 0xff]
                                 ) >> 8 & 0xff] << 8 ^
                                ma_dr_flac__crc16_table
                                [(((uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                   [((uint)uVar1 ^
                                                                    ((uint)uVar11 << 8 ^
                                                                    (uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar11 >> 8) ^
                                                                           (uint)(byte)(mVar7 >> 
                                                  0x38)]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar1 ^
                                                                ((uint)uVar11 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar11 >> 8) ^
                                                                       (uint)(byte)(mVar7 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [((uint)ma_dr_flac__crc16_table
                                                         [(uVar8 >> 8 ^
                                                          ((uint)ma_dr_flac__crc16_table
                                                                 [(uint)(uVar11 >> 8) ^
                                                                  (uint)(byte)(mVar7 >> 0x38)] << 8
                                                          ^ (uint)ma_dr_flac__crc16_table
                                                                  [((uint)uVar1 ^
                                                                   ((uint)uVar11 << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar11 >> 8) ^
                                                                          (uint)(byte)(mVar7 >> 0x38
                                                                                      )]) >> 8 &
                                                                   0xff) & 0xff]) >> 8 & 0xff) &
                                                          0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar1 ^
                                                                          ((uint)uVar11 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^ (uint)(byte)(mVar7 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar1 ^
                                                                ((uint)uVar11 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar11 >> 8) ^
                                                                       (uint)(byte)(mVar7 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar2 & 0xff]) >> 8 & 0xff ^ uVar3 & 0xffff) &
                                          0xff] << 8 ^
                                  (uint)ma_dr_flac__crc16_table
                                        [((uint)ma_dr_flac__crc16_table
                                                [((uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar1 ^
                                                                ((uint)uVar11 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar11 >> 8) ^
                                                                       (uint)(byte)(mVar7 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar1 ^
                                                                         ((uint)uVar11 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^ (uint)(byte)(mVar7 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar1 ^
                                                                ((uint)uVar11 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar11 >> 8) ^
                                                                       (uint)(byte)(mVar7 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                 uVar2 & 0xff] << 8 ^ uVar16 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(((uint)ma_dr_flac__crc16_table
                                                        [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar1 ^
                                                                          ((uint)uVar11 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^ (uint)(byte)(mVar7 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar1 ^
                                                                ((uint)uVar11 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar11 >> 8) ^
                                                                       (uint)(byte)(mVar7 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)ma_dr_flac__crc16_table
                                                               [(uVar8 >> 8 ^
                                                                ((uint)ma_dr_flac__crc16_table
                                                                       [(uint)(uVar11 >> 8) ^
                                                                        (uint)(byte)(mVar7 >> 0x38)]
                                                                 << 8 ^ (uint)
                                                  ma_dr_flac__crc16_table
                                                  [((uint)uVar1 ^
                                                   ((uint)uVar11 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar11 >> 8) ^
                                                          (uint)(byte)(mVar7 >> 0x38)]) >> 8 & 0xff)
                                                   & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar1 ^
                                                                          ((uint)uVar11 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^ (uint)(byte)(mVar7 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar8 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(mVar7 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar1 ^
                                                                ((uint)uVar11 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar11 >> 8) ^
                                                                       (uint)(byte)(mVar7 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                                  uVar2 & 0xff]) >> 8 & 0xff ^ uVar3 & 0xffff) &
                                                0xff]) >> 8 & 0xff]) >> 8 & 0xff ^ uVar16) & 0xff];
                    break;
                  case 1:
                    uVar13 = (uint)(ushort)(uVar11 << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(ushort)(uVar1 ^ uVar11 >> 8) & 0xff]);
                  case 2:
                    uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar8 ^ uVar13) >> 8 & 0xff]);
                  case 3:
                    uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                           ma_dr_flac__crc16_table[(uVar8 ^ uVar13 >> 8) & 0xff]);
                  case 4:
                    uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                           ma_dr_flac__crc16_table[uVar13 >> 8 ^ uVar2 & 0xff]);
                  case 5:
                    uVar13 = (uint)(ushort)((ushort)(uVar13 << 8) ^
                                           ma_dr_flac__crc16_table
                                           [(ulong)(uVar13 >> 8 ^ uVar3 & 0xffff) & 0xff]);
                  case 6:
                    uVar11 = (ushort)(uVar13 << 8) ^
                             ma_dr_flac__crc16_table[(uVar16 ^ uVar13) >> 8 & 0xff];
                  case 7:
                    uVar11 = uVar11 << 8 ^ ma_dr_flac__crc16_table[(uVar16 ^ uVar11 >> 8) & 0xff];
                    goto LAB_0016af76;
                  }
                }
                else {
LAB_0016af76:
                  bs->crc16 = uVar11;
                  bs->crc16CacheIgnoredBytes = 0;
                }
                bs->nextL2Line = uVar10 + 1;
                uVar6 = bs->cacheL2[uVar10];
                uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                        (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                        (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                        (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
                bs->crc16Cache = uVar6;
                uVar13 = uVar17;
              }
              else {
                mVar5 = ma_dr_flac__reload_cache(bs);
                if (mVar5 == 0) {
                  return 0;
                }
                if (0x40 - (ulong)bs->consumedBits < (ulong)uVar17) {
                  return 0;
                }
                uVar6 = bs->cache;
                uVar13 = bs->consumedBits + uVar17;
              }
              mVar7 = uVar6 << ((byte)uVar17 & 0x3f);
            }
            bs->cache = mVar7;
            bs->consumedBits = uVar13;
          }
        }
        if (local_4c == 1) {
          return 1;
        }
        local_4c = local_4c + -1;
        uVar10 = local_40;
      } while( true );
    }
  }
  return 0;
}

Assistant:

static ma_bool32 ma_dr_flac__read_and_seek_residual(ma_dr_flac_bs* bs, ma_uint32 blockSize, ma_uint32 order)
{
    ma_uint8 residualMethod;
    ma_uint8 partitionOrder;
    ma_uint32 samplesInPartition;
    ma_uint32 partitionsRemaining;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(blockSize != 0);
    if (!ma_dr_flac__read_uint8(bs, 2, &residualMethod)) {
        return MA_FALSE;
    }
    if (residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE && residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
        return MA_FALSE;
    }
    if (!ma_dr_flac__read_uint8(bs, 4, &partitionOrder)) {
        return MA_FALSE;
    }
    if (partitionOrder > 8) {
        return MA_FALSE;
    }
    if ((blockSize / (1 << partitionOrder)) <= order) {
        return MA_FALSE;
    }
    samplesInPartition = (blockSize / (1 << partitionOrder)) - order;
    partitionsRemaining = (1 << partitionOrder);
    for (;;)
    {
        ma_uint8 riceParam = 0;
        if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE) {
            if (!ma_dr_flac__read_uint8(bs, 4, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 15) {
                riceParam = 0xFF;
            }
        } else if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
            if (!ma_dr_flac__read_uint8(bs, 5, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 31) {
                riceParam = 0xFF;
            }
        }
        if (riceParam != 0xFF) {
            if (!ma_dr_flac__read_and_seek_residual__rice(bs, samplesInPartition, riceParam)) {
                return MA_FALSE;
            }
        } else {
            ma_uint8 unencodedBitsPerSample = 0;
            if (!ma_dr_flac__read_uint8(bs, 5, &unencodedBitsPerSample)) {
                return MA_FALSE;
            }
            if (!ma_dr_flac__seek_bits(bs, unencodedBitsPerSample * samplesInPartition)) {
                return MA_FALSE;
            }
        }
        if (partitionsRemaining == 1) {
            break;
        }
        partitionsRemaining -= 1;
        samplesInPartition = blockSize / (1 << partitionOrder);
    }
    return MA_TRUE;
}